

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_scan_avx2_256_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i *palVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i alVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  int iVar13;
  parasail_result_t *ppVar14;
  __m256i *ptr;
  int32_t *ptr_00;
  __m256i *ptr_01;
  __m256i *ptr_02;
  __m256i *ptr_03;
  int iVar15;
  int iVar16;
  long lVar17;
  char *pcVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  char *__format;
  ulong uVar22;
  long lVar23;
  ulong size;
  int iVar24;
  bool bVar25;
  undefined8 uVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  __m256i_32_t e;
  __m256i_32_t h;
  longlong local_a0;
  longlong lStack_98;
  longlong lStack_90;
  longlong lStack_88;
  longlong local_80;
  longlong lStack_78;
  longlong lStack_70;
  longlong lStack_68;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar18 = "profile";
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar18 = "profile->profile32.score";
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar18 = "profile->matrix";
      }
      else {
        uVar21 = profile->s1Len;
        if ((int)uVar21 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar18 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar18 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "open";
        }
        else {
          if (-1 < gap) {
            uVar19 = uVar21 - 1;
            size = (ulong)uVar21 + 7 >> 3;
            iVar24 = -open;
            iVar13 = ppVar3->min;
            uVar21 = 0x80000000 - iVar13;
            if (iVar13 != iVar24 && SBORROW4(iVar13,iVar24) == iVar13 + open < 0) {
              uVar21 = open | 0x80000000;
            }
            iVar13 = 0x7ffffffe - ppVar3->max;
            ppVar14 = parasail_result_new();
            if (ppVar14 != (parasail_result_t *)0x0) {
              ppVar14->flag = ppVar14->flag | 0x8400401;
              ptr = parasail_memalign___m256i(0x20,size);
              ptr_00 = parasail_memalign_int32_t(0x20,(ulong)(s2Len + 1));
              ptr_01 = parasail_memalign___m256i(0x20,size);
              ptr_02 = parasail_memalign___m256i(0x20,size);
              ptr_03 = parasail_memalign___m256i(0x20,size);
              if (ptr_03 != (__m256i *)0x0 &&
                  ((ptr_02 != (__m256i *)0x0 && ptr_01 != (__m256i *)0x0) &&
                  (ptr_00 != (int32_t *)0x0 && ptr != (__m256i *)0x0))) {
                iVar15 = s2Len + -1;
                auVar29._4_4_ = open;
                auVar29._0_4_ = open;
                auVar29._8_4_ = open;
                auVar29._12_4_ = open;
                auVar29._16_4_ = open;
                auVar29._20_4_ = open;
                auVar29._24_4_ = open;
                auVar29._28_4_ = open;
                auVar30._4_4_ = gap;
                auVar30._0_4_ = gap;
                auVar30._8_4_ = gap;
                auVar30._12_4_ = gap;
                auVar30._16_4_ = gap;
                auVar30._20_4_ = gap;
                auVar30._24_4_ = gap;
                auVar30._28_4_ = gap;
                iVar16 = uVar21 + 1;
                auVar27._4_4_ = iVar16;
                auVar27._0_4_ = iVar16;
                auVar27._8_4_ = iVar16;
                auVar27._12_4_ = iVar16;
                auVar27._16_4_ = iVar16;
                auVar27._20_4_ = iVar16;
                auVar27._24_4_ = iVar16;
                auVar27._28_4_ = iVar16;
                auVar28._4_4_ = iVar13;
                auVar28._0_4_ = iVar13;
                auVar28._8_4_ = iVar13;
                auVar28._12_4_ = iVar13;
                auVar28._16_4_ = iVar13;
                auVar28._20_4_ = iVar13;
                auVar28._24_4_ = iVar13;
                auVar28._28_4_ = iVar13;
                iVar20 = (int)size;
                iVar13 = -(iVar20 * gap);
                auVar32._4_4_ = iVar13;
                auVar32._0_4_ = iVar13;
                auVar32._8_4_ = iVar13;
                auVar32._12_4_ = iVar13;
                auVar32._16_4_ = iVar13;
                auVar32._20_4_ = iVar13;
                auVar32._24_4_ = iVar13;
                auVar32._28_4_ = iVar13;
                auVar32 = vpblendd_avx2(auVar32,SUB6432(ZEXT1664((undefined1  [16])0x0),0),1);
                auVar31 = ZEXT1232(CONCAT84(SUB128(ZEXT812(0),4),iVar16));
                auVar32 = vpaddd_avx2(auVar31,auVar32);
                iVar13 = iVar24;
                for (uVar22 = 0; uVar22 != size; uVar22 = uVar22 + 1) {
                  iVar16 = iVar13;
                  for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
                    lVar23 = (long)iVar16 - (ulong)(uint)open;
                    if (lVar23 < -0x7fffffff) {
                      lVar23 = -0x80000000;
                    }
                    *(int *)((long)&local_80 + lVar17 * 4) = iVar16;
                    *(int *)((long)&local_a0 + lVar17 * 4) = (int)lVar23;
                    iVar16 = iVar16 - iVar20 * gap;
                  }
                  palVar1 = ptr_02 + uVar22;
                  (*palVar1)[0] = local_80;
                  (*palVar1)[1] = lStack_78;
                  (*palVar1)[2] = lStack_70;
                  (*palVar1)[3] = lStack_68;
                  palVar1 = ptr + uVar22;
                  (*palVar1)[0] = local_a0;
                  (*palVar1)[1] = lStack_98;
                  (*palVar1)[2] = lStack_90;
                  (*palVar1)[3] = lStack_88;
                  iVar13 = iVar13 - gap;
                }
                *ptr_00 = 0;
                for (uVar22 = 1; s2Len + 1 != uVar22; uVar22 = uVar22 + 1) {
                  ptr_00[uVar22] = iVar24;
                  iVar24 = iVar24 - gap;
                }
                alVar8 = (__m256i)vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar29);
                for (uVar21 = iVar20 - 1U; -1 < (int)uVar21; uVar21 = uVar21 - 1) {
                  ptr_03[uVar21] = alVar8;
                  alVar8 = (__m256i)vpsubd_avx2((undefined1  [32])alVar8,auVar30);
                }
                uVar22 = 0;
                auVar7 = vpmovsxbd_avx2(ZEXT816(0x605040302010000));
                auVar33 = ZEXT3264(auVar28);
                auVar34 = ZEXT3264(auVar27);
                while (uVar22 != (uint)s2Len) {
                  auVar12 = vpermd_avx2(auVar7,(undefined1  [32])ptr_02[iVar20 - 1U]);
                  auVar12 = vpblendd_avx2(auVar12,ZEXT432((uint)ptr_00[uVar22]),1);
                  iVar13 = ppVar3->mapper[(byte)s2[uVar22]];
                  auVar9 = vpsubd_avx2(auVar27,(undefined1  [32])*ptr_03);
                  auVar6 = auVar27;
                  for (lVar17 = 0; size << 5 != lVar17; lVar17 = lVar17 + 0x20) {
                    auVar5 = vpaddd_avx2(auVar12,*(undefined1 (*) [32])
                                                  ((long)pvVar2 +
                                                  lVar17 + (long)(iVar13 * iVar20) * 0x20));
                    auVar12 = *(undefined1 (*) [32])((long)*ptr_02 + lVar17);
                    auVar10 = vpsubd_avx2(*(undefined1 (*) [32])((long)*ptr + lVar17),auVar30);
                    auVar11 = vpsubd_avx2(auVar12,auVar29);
                    auVar9 = vpaddd_avx2(auVar9,*(undefined1 (*) [32])((long)*ptr_03 + lVar17));
                    auVar10 = vpmaxsd_avx2(auVar10,auVar11);
                    auVar6 = vpmaxsd_avx2(auVar6,auVar9);
                    *(undefined1 (*) [32])((long)*ptr + lVar17) = auVar10;
                    auVar9 = vpmaxsd_avx2(auVar10,auVar5);
                    *(undefined1 (*) [32])((long)*ptr_01 + lVar17) = auVar9;
                  }
                  auVar12 = vpermd_avx2(auVar7,auVar9);
                  lVar17 = uVar22 + 1;
                  uVar22 = uVar22 + 1;
                  auVar9 = vpblendd_avx2(auVar12,ZEXT432((uint)ptr_00[lVar17]),1);
                  auVar12 = vpaddd_avx2(auVar9,(undefined1  [32])*ptr_03);
                  auVar12 = vpmaxsd_avx2(auVar6,auVar12);
                  iVar13 = 6;
                  while( true ) {
                    auVar6 = vperm2i128_avx2(auVar12,auVar12,8);
                    auVar6 = vpalignr_avx2(auVar12,auVar6,0xc);
                    bVar25 = iVar13 == 0;
                    iVar13 = iVar13 + -1;
                    if (bVar25) break;
                    auVar6 = vpaddd_avx2(auVar6,auVar32);
                    auVar12 = vpmaxsd_avx2(auVar12,auVar6);
                  }
                  auVar12 = vpaddd_avx2(auVar6,auVar31);
                  auVar6 = vpmaxsd_avx2(auVar9,auVar12);
                  for (lVar17 = 0; size << 5 != lVar17; lVar17 = lVar17 + 0x20) {
                    auVar12 = vpsubd_avx2(auVar12,auVar30);
                    auVar6 = vpsubd_avx2(auVar6,auVar29);
                    auVar12 = vpmaxsd_avx2(auVar12,auVar6);
                    auVar6 = vpmaxsd_avx2(auVar12,*(undefined1 (*) [32])((long)*ptr_01 + lVar17));
                    *(undefined1 (*) [32])((long)*ptr_02 + lVar17) = auVar6;
                    auVar9 = vpminsd_avx2(auVar33._0_32_,auVar6);
                    auVar33 = ZEXT3264(auVar9);
                    auVar9 = vpmaxsd_avx2(auVar34._0_32_,auVar6);
                    auVar34 = ZEXT3264(auVar9);
                  }
                }
                alVar8 = ptr_02[(ulong)uVar19 % size];
                for (iVar13 = 0; iVar13 < 7 - (int)(uVar19 / size); iVar13 = iVar13 + 1) {
                  auVar32 = vperm2i128_avx2((undefined1  [32])alVar8,(undefined1  [32])alVar8,0x28);
                  alVar8 = (__m256i)vpalignr_avx2((undefined1  [32])alVar8,auVar32,0xc);
                }
                auVar32 = vpcmpgtd_avx2(auVar27,auVar33._0_32_);
                auVar27 = vpcmpgtd_avx2(auVar34._0_32_,auVar28);
                auVar32 = vpor_avx2(auVar27,auVar32);
                if ((((((((auVar32 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar32 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar32 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar32 >> 0x7f,0) == '\0') &&
                      (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar32 >> 0xbf,0) == '\0') &&
                    (auVar32 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar32[0x1f]) {
                  auVar32 = vpermq_avx2((undefined1  [32])alVar8,0xff);
                  auVar4 = vpshufd_avx(auVar32._0_16_,0x55);
                  auVar4 = vpinsrd_avx(auVar4,uVar19,1);
                  uVar26 = auVar4._0_8_;
                }
                else {
                  *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
                  uVar26 = 0;
                  iVar15 = 0;
                }
                ppVar14->score = (int)uVar26;
                ppVar14->end_query = (int)((ulong)uVar26 >> 0x20);
                ppVar14->end_ref = iVar15;
                parasail_free(ptr_03);
                parasail_free(ptr_02);
                parasail_free(ptr_01);
                parasail_free(ptr_00);
                parasail_free(ptr);
                return ppVar14;
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar18 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_scan_profile_avx2_256_32",pcVar18);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m256i* restrict pvHt = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    int32_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m256i(32, segLen);
    boundary = parasail_memalign_int32_t(32, s2Len+1);
    pvHt= parasail_memalign___m256i(32, segLen);
    pvH = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!boundary) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvGapper) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m256i_32_t h;
            __m256i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm256_store_si256(&pvH[index], h.m);
            _mm256_store_si256(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vHt;
        __m256i vF;
        __m256i vH;
        __m256i vHp;
        __m256i *pvW;
        __m256i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHp = _mm256_insert_epi32_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm256_sub_epi32(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vE = _mm256_load_si256(pvE+i);
            vW = _mm256_load_si256(pvW+i);
            vE = _mm256_max_epi32(
                    _mm256_sub_epi32(vE, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vHp = _mm256_add_epi32(vHp, vW);
            vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[i]));
            vHt = _mm256_max_epi32(vE, vHp);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHt = _mm256_insert_epi32_rpl(vHt, boundary[j+1], 0);
        vF = _mm256_max_epi32(vF, _mm256_add_epi32(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            vF = _mm256_max_epi32(vF, vFt);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        vH = _mm256_max_epi32(vHt, vF);
        for (i=0; i<segLen; ++i) {
            vHt = _mm256_load_si256(pvHt+i);
            vF = _mm256_max_epi32(
                    _mm256_sub_epi32(vF, vGapE),
                    _mm256_sub_epi32(vH, vGapO));
            vH = _mm256_max_epi32(vHt, vF);
            _mm256_store_si256(pvH+i, vH);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
        } 


#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m256i vH = _mm256_load_si256(pvH + offset);
        for (k=0; k<position; ++k) {
            vH = _mm256_slli_si256_rpl(vH, 4);
        }
        score = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(boundary);
    parasail_free(pvE);

    return result;
}